

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

bool __thiscall doctest::AssertData::StringContains::check(StringContains *this,String *str)

{
  bool bVar1;
  long in_RDI;
  String *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    bVar1 = doctest::operator==((String *)
                                CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8);
  }
  else {
    bVar1 = doctest::operator==((Contains *)
                                CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8);
  }
  return bVar1;
}

Assistant:

bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }